

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcompress.c
# Opt level: O0

int compress2mem_from_mem
              (char *inmemptr,size_t inmemsize,char **buffptr,size_t *buffsize,
              _func_void_ptr_void_ptr_size_t *mem_realloc,size_t *filesize,int *status)

{
  int iVar1;
  long lVar2;
  long *in_RCX;
  long *in_RDX;
  undefined8 in_RDI;
  code *in_R8;
  undefined8 *in_R9;
  int *in_stack_00000008;
  z_stream c_stream;
  int err;
  undefined8 local_b0 [3];
  long local_98;
  undefined4 local_90;
  undefined8 local_88;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  int local_3c;
  undefined8 *local_38;
  code *local_30;
  long *local_28;
  long *local_20;
  undefined8 local_10;
  int local_4;
  
  if (*in_stack_00000008 < 1) {
    local_70 = 0;
    local_68 = 0;
    local_60 = 0;
    local_38 = in_R9;
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_10 = in_RDI;
    iVar1 = deflateInit2_(local_b0,1,8,0x1f,8,0,"1.2.11",0x70);
    if (iVar1 == 0) {
      local_b0[0] = local_10;
      local_98 = *local_20;
      local_90 = (undefined4)*local_28;
      local_3c = 0;
      while (local_3c = deflate(local_b0,4), local_3c != 1) {
        if (local_3c != 0) {
          deflateEnd(local_b0);
          *in_stack_00000008 = 0x19d;
          return 0x19d;
        }
        if (local_30 == (code *)0x0) {
          deflateEnd(local_b0);
          *in_stack_00000008 = 0x19d;
          return 0x19d;
        }
        lVar2 = (*local_30)(*local_20,*local_28 + 0x7080);
        *local_20 = lVar2;
        if (*local_20 == 0) {
          deflateEnd(local_b0);
          *in_stack_00000008 = 0x19d;
          return 0x19d;
        }
        local_90 = 0x7080;
        local_98 = *local_20 + *local_28;
        *local_28 = *local_28 + 0x7080;
      }
      if (local_38 != (undefined8 *)0x0) {
        *local_38 = local_88;
      }
      iVar1 = deflateEnd(local_b0);
      if (iVar1 == 0) {
        local_4 = *in_stack_00000008;
      }
      else {
        *in_stack_00000008 = 0x19d;
        local_4 = 0x19d;
      }
    }
    else {
      *in_stack_00000008 = 0x19d;
      local_4 = 0x19d;
    }
  }
  else {
    local_4 = *in_stack_00000008;
  }
  return local_4;
}

Assistant:

int compress2mem_from_mem(                                                
             char *inmemptr,     /* I - memory pointer to uncompressed bytes */
             size_t inmemsize,   /* I - size of input uncompressed file      */
             char **buffptr,   /* IO - memory pointer for compressed file    */
             size_t *buffsize,   /* IO - size of buffer, in bytes           */
             void *(*mem_realloc)(void *p, size_t newsize), /* function     */
             size_t *filesize,   /* O - size of file, in bytes              */
             int *status)        /* IO - error status                       */

/*
  Compress the file into memory.  Fill whatever amount of memory has
  already been allocated, then realloc more memory, using the supplied
  input function, if necessary.
*/
{
    int err;
    z_stream c_stream;  /* compression stream */

    if (*status > 0)
        return(*status);

    c_stream.zalloc = (alloc_func)0;
    c_stream.zfree = (free_func)0;
    c_stream.opaque = (voidpf)0;

    /* Initialize the compression.  The argument (15+16) tells the 
       compressor that we are to use the gzip algorythm.
       Also use Z_BEST_SPEED for maximum speed with very minor loss
       in compression factor. */
    err = deflateInit2(&c_stream, Z_BEST_SPEED, Z_DEFLATED,
                       (15+16), 8, Z_DEFAULT_STRATEGY);

    if (err != Z_OK) return(*status = 413);

    c_stream.next_in = (unsigned char*)inmemptr;
    c_stream.avail_in = inmemsize;

    c_stream.next_out = (unsigned char*) *buffptr;
    c_stream.avail_out = *buffsize;

    for (;;) {
        /* compress as much of the input as will fit in the output */
        err = deflate(&c_stream, Z_FINISH);

        if (err == Z_STREAM_END) {  /* We reached the end of the input */
	   break;
        } else if (err == Z_OK ) { /* need more space in output buffer */

            if (mem_realloc) {   
                *buffptr = mem_realloc(*buffptr,*buffsize + BUFFINCR);
                if (*buffptr == NULL){
                    deflateEnd(&c_stream);
                    return(*status = 413);  /* memory allocation failed */
                }

                c_stream.avail_out = BUFFINCR;
                c_stream.next_out = (unsigned char*) (*buffptr + *buffsize);
                *buffsize = *buffsize + BUFFINCR;

            } else  { /* error: no realloc function available */
                deflateEnd(&c_stream);
                return(*status = 413);
            }
        } else {  /* some other error */
            deflateEnd(&c_stream);
            return(*status = 413);
        }
    }

    /* Set the output file size to be the total output data */
    if (filesize) *filesize = c_stream.total_out;

    /* End the compression */
    err = deflateEnd(&c_stream);

    if (err != Z_OK) return(*status = 413);
     
    return(*status);
}